

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vec4 tcu::sRGB8ToLinear(UVec4 *cs)

{
  uint uVar1;
  uint uVar2;
  uint *in_RDI;
  Vec4 VVar3;
  
  VVar3.m_data[1] = 0.0;
  VVar3.m_data[0] = (float)*(uint *)(s_srgb8Lut + (ulong)cs->m_data[0] * 4);
  uVar1 = *(uint *)(s_srgb8Lut + (ulong)cs->m_data[1] * 4);
  uVar2 = *(uint *)(s_srgb8Lut + (ulong)cs->m_data[2] * 4);
  *in_RDI = *(uint *)(s_srgb8Lut + (ulong)cs->m_data[0] * 4);
  in_RDI[1] = uVar1;
  in_RDI[2] = uVar2;
  in_RDI[3] = 0x3f800000;
  VVar3.m_data[2] = (float)uVar1;
  VVar3.m_data[3] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 sRGB8ToLinear (const UVec4& cs)
{
	return Vec4(sRGB8ChannelToLinear(cs[0]),
				sRGB8ChannelToLinear(cs[1]),
				sRGB8ChannelToLinear(cs[2]),
				1.0f);
}